

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O0

void __thiscall
llvm::ScopedPrinter::printBinaryImpl
          (ScopedPrinter *this,StringRef Label,StringRef Str,ArrayRef<unsigned_char> Data,bool Block
          ,uint32_t StartOffset)

{
  ArrayRef<unsigned_char> Bytes;
  StringRef Str_00;
  StringRef Str_01;
  ArrayRef<unsigned_char> Bytes_00;
  StringRef Str_02;
  StringRef Str_03;
  bool bVar1;
  size_t sVar2;
  raw_ostream *prVar3;
  size_t sVar4;
  Optional<unsigned_long> FirstByteOffset;
  Optional<unsigned_long> FirstByteOffset_00;
  Optional<unsigned_long> local_120;
  uchar *local_110;
  size_type local_108;
  FormattedBytes local_100;
  ScopedPrinter *local_d0;
  char *local_c8;
  size_t local_c0;
  size_t local_b8;
  ulong local_b0;
  Optional<unsigned_long> local_a8;
  uchar *local_98;
  size_type local_90;
  FormattedBytes local_88;
  ScopedPrinter *local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  byte local_31;
  ScopedPrinter *pSStack_30;
  bool Block_local;
  ScopedPrinter *this_local;
  StringRef Str_local;
  StringRef Label_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (ScopedPrinter *)Str.Data;
  sVar4 = Label.Length;
  Str_local.Length = (size_t)Label.Data;
  local_31 = Block;
  pSStack_30 = this;
  sVar2 = ArrayRef<unsigned_char>::size(&Data);
  if (0x10 < sVar2) {
    local_31 = 1;
  }
  if ((local_31 & 1) == 0) {
    prVar3 = startLine(this);
    local_c0 = Str_local.Length;
    Str_01.Length = sVar4;
    Str_01.Data = (char *)Str_local.Length;
    local_b8 = sVar4;
    prVar3 = raw_ostream::operator<<(prVar3,Str_01);
    raw_ostream::operator<<(prVar3,":");
    bVar1 = StringRef::empty((StringRef *)&this_local);
    if (!bVar1) {
      prVar3 = raw_ostream::operator<<(this->OS," ");
      local_d0 = this_local;
      local_c8 = Str_local.Data;
      Str_00.Length = (size_t)Str_local.Data;
      Str_00.Data = (char *)this_local;
      raw_ostream::operator<<(prVar3,Str_00);
    }
    prVar3 = raw_ostream::operator<<(this->OS," (");
    local_110 = Data.Data;
    local_108 = Data.Length;
    Optional<unsigned_long>::Optional(&local_120,None);
    sVar2 = ArrayRef<unsigned_char>::size(&Data);
    Bytes.Length = local_108;
    Bytes.Data = local_110;
    FirstByteOffset_00.Storage._9_7_ = 0;
    FirstByteOffset_00.Storage.field_0 = local_120.Storage.field_0;
    FirstByteOffset_00.Storage.hasVal = local_120.Storage.hasVal;
    format_bytes(&local_100,Bytes,FirstByteOffset_00,(uint32_t)sVar2,'\x01',0,true);
    prVar3 = raw_ostream::operator<<(prVar3,&local_100);
    raw_ostream::operator<<(prVar3,")\n");
  }
  else {
    prVar3 = startLine(this);
    local_48 = Str_local.Length;
    Str_03.Length = sVar4;
    Str_03.Data = (char *)Str_local.Length;
    local_40 = sVar4;
    raw_ostream::operator<<(prVar3,Str_03);
    bVar1 = StringRef::empty((StringRef *)&this_local);
    if (!bVar1) {
      prVar3 = raw_ostream::operator<<(this->OS,": ");
      local_58 = this_local;
      local_50 = Str_local.Data;
      Str_02.Length = (size_t)Str_local.Data;
      Str_02.Data = (char *)this_local;
      raw_ostream::operator<<(prVar3,Str_02);
    }
    raw_ostream::operator<<(this->OS," (\n");
    bVar1 = ArrayRef<unsigned_char>::empty(&Data);
    if (!bVar1) {
      prVar3 = this->OS;
      local_98 = Data.Data;
      local_90 = Data.Length;
      local_b0 = (ulong)StartOffset;
      Optional<unsigned_long>::Optional(&local_a8,&local_b0);
      Bytes_00.Length = local_90;
      Bytes_00.Data = local_98;
      FirstByteOffset.Storage._9_7_ = 0;
      FirstByteOffset.Storage.field_0 = local_a8.Storage.field_0;
      FirstByteOffset.Storage.hasVal = local_a8.Storage.hasVal;
      format_bytes_with_ascii
                (&local_88,Bytes_00,FirstByteOffset,0x10,'\x04',(this->IndentLevel + 1) * 2,true);
      prVar3 = raw_ostream::operator<<(prVar3,&local_88);
      raw_ostream::operator<<(prVar3,"\n");
    }
    prVar3 = startLine(this);
    raw_ostream::operator<<(prVar3,")\n");
  }
  return;
}

Assistant:

void ScopedPrinter::printBinaryImpl(StringRef Label, StringRef Str,
                                    ArrayRef<uint8_t> Data, bool Block,
                                    uint32_t StartOffset) {
  if (Data.size() > 16)
    Block = true;

  if (Block) {
    startLine() << Label;
    if (!Str.empty())
      OS << ": " << Str;
    OS << " (\n";
    if (!Data.empty())
      OS << format_bytes_with_ascii(Data, StartOffset, 16, 4,
                                    (IndentLevel + 1) * 2, true)
         << "\n";
    startLine() << ")\n";
  } else {
    startLine() << Label << ":";
    if (!Str.empty())
      OS << " " << Str;
    OS << " (" << format_bytes(Data, None, Data.size(), 1, 0, true) << ")\n";
  }
}